

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O2

void __thiscall
slang::analysis::AnalyzedAssertion::AnalyzedAssertion
          (AnalyzedAssertion *this,AnalysisContext *context,TimingControl *contextualClock,
          AnalyzedProcedure *procedure,Statement *stmt,Symbol *checkerInstance)

{
  TimingControl *this_00;
  TimingControl *left;
  Symbol *symbol;
  bool bVar1;
  AnalyzedScope *pAVar2;
  Diagnostic *this_01;
  size_t i;
  ulong uVar3;
  TimingControl *right;
  SourceRange sourceRange;
  TimingControl *contextualClock_local;
  VisitFlags local_dc;
  VisitResult result;
  ClockVisitor visitor;
  
  this->checkerScope = (AnalyzedScope *)0x0;
  contextualClock_local = contextualClock;
  if (checkerInstance == (Symbol *)0x0) {
    visitor.parentSymbol = (procedure->analyzedSymbol).ptr;
    visitor.expansionStack.super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>
    .data_ = (pointer)visitor.expansionStack.
                      super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>.
                      firstElement;
    visitor.expansionStack.super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>
    .len = 0;
    visitor.expansionStack.super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>
    .cap = 2;
    visitor.globalFutureSampledValueCall._0_7_ = 0;
    visitor.globalFutureSampledValueCall._7_1_ = 0;
    visitor.hasInferredClockCall = false;
    visitor.hasMatchItems = false;
    visitor.bad = false;
    if (((visitor.parentSymbol)->parentScope != (Scope *)0x0) &&
       ((visitor.parentSymbol)->parentScope->thisSym->kind == CheckerInstanceBody)) {
      visitor.hasInferredClockCall = true;
    }
    this_00 = *(TimingControl **)(stmt + 1);
    local_dc = None;
    right = this_00;
    visitor.context = context;
    visitor.procedure = procedure;
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::analysis::VisitFlags>
              (&result,(AssertionExpr *)this_00,&visitor,&contextualClock_local,&local_dc);
    if ((visitor.bad == false) &&
       (1 < result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len)) {
      left = *result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_;
      for (uVar3 = 1;
          uVar3 < result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len;
          uVar3 = uVar3 + 1) {
        right = result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_[uVar3];
        bVar1 = isSameClock(left,right);
        if (!bVar1) {
          symbol = (procedure->analyzedSymbol).ptr;
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00->syntax);
          this_01 = AnalysisContext::addDiag(context,symbol,(DiagCode)0x7000e,sourceRange);
          Diagnostic::addNote(this_01,(DiagCode)0xa000e,left->sourceRange);
          right = (TimingControl *)0xa000e;
          Diagnostic::addNote(this_01,(DiagCode)0xa000e,
                              result.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>
                              .data_[uVar3]->sourceRange);
          break;
        }
      }
    }
    SmallVectorBase<const_slang::ast::TimingControl_*>::cleanup
              ((SmallVectorBase<const_slang::ast::TimingControl_*> *)&result,(EVP_PKEY_CTX *)right);
    SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>::cleanup
              (&visitor.expansionStack.
                super_SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>,
               (EVP_PKEY_CTX *)right);
  }
  else {
    pAVar2 = AnalysisManager::analyzeScopeBlocking
                       ((context->manager).ptr,(Scope *)(checkerInstance[1].name._M_str + 0x40),
                        procedure);
    this->checkerScope = pAVar2;
  }
  return;
}

Assistant:

AnalyzedAssertion::AnalyzedAssertion(AnalysisContext& context, const TimingControl* contextualClock,
                                     const AnalyzedProcedure& procedure, const Statement& stmt,
                                     const Symbol* checkerInstance) {
    if (checkerInstance) {
        checkerScope = &context.manager->analyzeScopeBlocking(
            checkerInstance->as<CheckerInstanceSymbol>().body, &procedure);
    }
    else {
        ClockVisitor visitor(context, &procedure, *procedure.analyzedSymbol);

        auto& propSpec = stmt.as<ConcurrentAssertionStatement>().propertySpec;
        auto result = propSpec.visit(visitor, contextualClock, VisitFlags::None);

        if (!visitor.bad && result.clocks.size() > 1) {
            // There must be a unique semantic leading clock.
            auto firstClock = result.clocks[0];
            for (size_t i = 1; i < result.clocks.size(); i++) {
                if (!isSameClock(*firstClock, *result.clocks[i])) {
                    SLANG_ASSERT(propSpec.syntax);
                    auto& diag = context.addDiag(*procedure.analyzedSymbol, diag::NoUniqueClock,
                                                 propSpec.syntax->sourceRange());
                    diag.addNote(diag::NoteClockHere, firstClock->sourceRange);
                    diag.addNote(diag::NoteClockHere, result.clocks[i]->sourceRange);
                    break;
                }
            }
        }
    }
}